

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,bool qualified)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cpp *pcVar1;
  cpp *pcVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string inner_name;
  string local_60;
  string local_40;
  
  pcVar1 = this;
  do {
    pcVar2 = pcVar1;
    pcVar1 = *(cpp **)(pcVar2 + 0x18);
  } while (*(cpp **)(pcVar2 + 0x18) != (cpp *)0x0);
  psVar3 = *(string **)(pcVar2 + 8);
  std::__cxx11::string::substr((ulong)&inner_name,*(ulong *)(this + 8));
  if ((char)descriptor == '\0') {
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pcVar2;
    anon_unknown_0::DotsToUnderscores(&local_a0,&inner_name);
    std::operator+(__return_storage_ptr__,__lhs,&local_a0);
    psVar3 = &local_a0;
  }
  else {
    anon_unknown_0::DotsToColons(&local_40,psVar3);
    std::operator+(&local_a0,"::",&local_40);
    anon_unknown_0::DotsToUnderscores(&local_60,&inner_name);
    std::operator+(__return_storage_ptr__,&local_a0,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    psVar3 = &local_40;
  }
  std::__cxx11::string::~string((string *)psVar3);
  std::__cxx11::string::~string((string *)&inner_name);
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const Descriptor* descriptor, bool qualified) {

  // Find "outer", the descriptor of the top-level message in which
  // "descriptor" is embedded.
  const Descriptor* outer = descriptor;
  while (outer->containing_type() != NULL) outer = outer->containing_type();

  const string& outer_name = outer->full_name();
  string inner_name = descriptor->full_name().substr(outer_name.size());

  if (qualified) {
    return "::" + DotsToColons(outer_name) + DotsToUnderscores(inner_name);
  } else {
    return outer->name() + DotsToUnderscores(inner_name);
  }
}